

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O2

void __thiscall test_iir_filter::test_method(test_iir_filter *this)

{
  long lVar1;
  undefined8 local_248;
  double local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined **local_208;
  undefined1 local_200;
  undefined8 *local_1f8;
  char *local_1f0;
  array<double,_7UL> response;
  double local_1a8 [7];
  iir_filter<6> lp;
  array<double,_7UL> a;
  array<double,_7UL> b;
  
  local_1a8[5] = 0.0;
  local_1a8[6] = 0.0;
  local_1a8[3] = 0.0;
  local_1a8[4] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[0] = 1.0;
  response._M_elems[4] = 3.15672364704611e-05;
  response._M_elems[5] = 7.65594176229739e-05;
  response._M_elems[2] = 2.7972345612513e-06;
  response._M_elems[3] = 1.07425029331562e-05;
  response._M_elems[0] = 4.24141395075581e-08;
  response._M_elems[1] = 4.88861571352154e-07;
  response._M_elems[6] = 0.000160949149809997;
  butter_lp<6>((tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> *)&lp,2048000.0,
               40000.0);
  b._M_elems[0] = lp.b_m._M_elems[6];
  b._M_elems[1] = lp.a_m._M_elems[0];
  b._M_elems[2] = lp.a_m._M_elems[1];
  b._M_elems[3] = lp.a_m._M_elems[2];
  b._M_elems[4] = lp.a_m._M_elems[3];
  b._M_elems[5] = lp.a_m._M_elems[4];
  b._M_elems[6] = lp.a_m._M_elems[5];
  a._M_elems[0] = lp.gain_m;
  a._M_elems[1] = lp.b_m._M_elems[0];
  a._M_elems[2] = lp.b_m._M_elems[1];
  a._M_elems[3] = lp.b_m._M_elems[2];
  a._M_elems[4] = lp.b_m._M_elems[3];
  a._M_elems[5] = lp.b_m._M_elems[4];
  a._M_elems[6] = lp.b_m._M_elems[5];
  iir_filter<6>::iir_filter(&lp,lp.a_m._M_elems[6],&b,&a);
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 8) {
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x40,&local_228);
    local_200 = 0;
    local_208 = &PTR__lazy_ostream_00116a40;
    local_1f8 = &boost::unit_test::lazy_ostream::inst;
    local_1f0 = "";
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_230 = "";
    local_240 = iir_filter<6>::operator()(&lp,*(double *)((long)local_1a8 + lVar1));
    local_248 = 0x3d719799812dea11;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (&local_208,&local_238,0x40,1,8,(long)response._M_elems + lVar1,"response[counter]",
               &local_240,"lp(signal[counter])",&local_248,
               "::boost::math::fpc::percent_tolerance(1e-12)");
  }
  iir_filter<6>::~iir_filter(&lp);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_iir_filter)
{
    std::array<double, 7> signal = { 1.0 };
    // generated with octave signal package
    // >> pkg load signal;
    // >> [b,a] = butter(6, 2*40000/2048000);
    // >> v = impz(b, a, 7)
    std::array<double, 7> response = {
        4.24141395075581e-08, 4.88861571352154e-07, 2.79723456125130e-06,
        1.07425029331562e-05, 3.15672364704611e-05, 7.65594176229739e-05,
        1.60949149809997e-04
    };
    double gain;
    std::array<double, 7 > b;
    std::array<double, 7 > a;

    std::tie(gain, b, a) = butter_lp<6>(2048000, 40000);
    iir_filter<6> lp(gain, b, a);
    for(size_t counter = 0; counter != signal.size(); ++counter)
    {
        BOOST_CHECK_CLOSE(response[counter], lp(signal[counter]), 1e-12);
    }
}